

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isBilinearRangeValid
               (LookupPrecision *prec,ColorQuad *quad,Vec2 *xBounds,Vec2 *yBounds,float searchStep,
               Vec4 *result)

{
  float x_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  undefined1 local_88 [8];
  Vec4 c1;
  Vector<float,_4> local_68;
  undefined1 local_58 [8];
  Vec4 c0;
  float a;
  float x;
  Vec4 *result_local;
  float searchStep_local;
  Vec2 *yBounds_local;
  Vec2 *xBounds_local;
  ColorQuad *quad_local;
  LookupPrecision *prec_local;
  
  bVar1 = isInColorBounds(prec,quad,result);
  if (bVar1) {
    for (c0.m_data[3] = Vector<float,_2>::x(xBounds); fVar3 = c0.m_data[3],
        fVar2 = Vector<float,_2>::y(xBounds), x_00 = c0.m_data[3], fVar3 < fVar2 + searchStep;
        c0.m_data[3] = searchStep + c0.m_data[3]) {
      fVar3 = Vector<float,_2>::y(xBounds);
      c0.m_data[2] = de::min<float>(x_00,fVar3);
      operator*((tcu *)&local_68,&quad->p00,1.0 - c0.m_data[2]);
      operator*((tcu *)(c1.m_data + 2),&quad->p10,c0.m_data[2]);
      operator+((tcu *)local_58,&local_68,(Vector<float,_4> *)(c1.m_data + 2));
      operator*((tcu *)&local_98,&quad->p01,1.0 - c0.m_data[2]);
      operator*((tcu *)&local_a8,&quad->p11,c0.m_data[2]);
      operator+((tcu *)local_88,&local_98,&local_a8);
      bVar1 = isLinearRangeValid(prec,(Vec4 *)local_58,(Vec4 *)local_88,yBounds,result);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool isBilinearRangeValid (const LookupPrecision&	prec,
								  const ColorQuad&			quad,
								  const Vec2&				xBounds,
								  const Vec2&				yBounds,
								  const float				searchStep,
								  const Vec4&				result)
{
	DE_ASSERT(xBounds.x() <= xBounds.y());
	DE_ASSERT(yBounds.x() <= yBounds.y());
	DE_ASSERT(xBounds.x() + searchStep > xBounds.x()); // step is not effectively 0
	DE_ASSERT(xBounds.y() + searchStep > xBounds.y());

	if (!isInColorBounds(prec, quad, result))
		return false;

	for (float x = xBounds.x(); x < xBounds.y()+searchStep; x += searchStep)
	{
		const float		a	= de::min(x, xBounds.y());
		const Vec4		c0	= quad.p00*(1.0f - a) + quad.p10*a;
		const Vec4		c1	= quad.p01*(1.0f - a) + quad.p11*a;

		if (isLinearRangeValid(prec, c0, c1, yBounds, result))
			return true;
	}

	return false;
}